

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  pointer this_00;
  size_type sVar2;
  ostream *poVar3;
  long in_RSI;
  long in_RDI;
  double dur;
  Colour colour;
  double in_stack_000000e8;
  SectionStats *in_stack_ffffffffffffff68;
  ConsoleReporter *in_stack_ffffffffffffff70;
  IConfig *in_stack_ffffffffffffff78;
  string local_50 [32];
  undefined8 local_30;
  long local_10;
  
  local_10 = in_RSI;
  this_00 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
            operator->((unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_> *
                       )0x13f050);
  TablePrinter::close(this_00,(int)in_RSI);
  if ((*(byte *)(local_10 + 0x78) & 1) != 0) {
    lazyPrint(in_stack_ffffffffffffff70);
    Colour::Colour((Colour *)in_stack_ffffffffffffff70,
                   (Code)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    sVar2 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                      ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                       (in_RDI + 0x148));
    if (sVar2 < 2) {
      std::operator<<(*(ostream **)(in_RDI + 0x18),"\nNo assertions in test case");
    }
    else {
      std::operator<<(*(ostream **)(in_RDI + 0x18),"\nNo assertions in section");
    }
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18)," \'");
    poVar3 = std::operator<<(poVar3,(string *)(local_10 + 8));
    poVar3 = std::operator<<(poVar3,"\'\n");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Colour::~Colour((Colour *)0x13f160);
  }
  local_30 = *(undefined8 *)(local_10 + 0x70);
  clara::std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            in_stack_ffffffffffffff70);
  bVar1 = shouldShowDuration(in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70);
  if (bVar1) {
    poVar3 = *(ostream **)(in_RDI + 0x18);
    getFormattedDuration_abi_cxx11_(in_stack_000000e8);
    poVar3 = std::operator<<(poVar3,local_50);
    in_stack_ffffffffffffff70 = (ConsoleReporter *)std::operator<<(poVar3," s: ");
    in_stack_ffffffffffffff68 =
         (SectionStats *)
         std::operator<<((ostream *)in_stack_ffffffffffffff70,(string *)(local_10 + 8));
    std::ostream::operator<<(in_stack_ffffffffffffff68,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
  }
  if ((*(byte *)(in_RDI + 0x170) & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x170) = 0;
  }
  StreamingReporterBase<Catch::ConsoleReporter>::sectionEnded
            (&in_stack_ffffffffffffff70->super_StreamingReporterBase<Catch::ConsoleReporter>,
             in_stack_ffffffffffffff68);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        Colour colour(Colour::ResultError);
        if (m_sectionStack.size() > 1)
            stream << "\nNo assertions in section";
        else
            stream << "\nNo assertions in test case";
        stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << std::endl;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}